

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O3

void __thiscall AtomicFile::AtomicFile(AtomicFile *this,string *path)

{
  Path local_50;
  
  Path::Path(&local_50,path);
  AtomicFile(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._data._M_dataplus._M_p != &local_50._data.field_2) {
    operator_delete(local_50._data._M_dataplus._M_p,local_50._data.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._original._M_dataplus._M_p != &local_50._original.field_2) {
    operator_delete(local_50._original._M_dataplus._M_p,
                    local_50._original.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

AtomicFile::AtomicFile (std::string path) : AtomicFile (Path (path))
{
}